

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> * __thiscall
trompeloeil::list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_>::operator=
          (list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *this,
          list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *r)

{
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *plVar1;
  list_elem<trompeloeil::call_matcher_base<int_&(int_&)>_> *n;
  
  n = this;
  if (this != r) {
    plVar1 = r->next;
    this->next = plVar1;
    this->prev = r;
    plVar1->prev = this;
    plVar1 = r->prev;
    this->prev = plVar1;
    plVar1->next = this;
    r->next = r;
    r->prev = r;
  }
  return n;
}

Assistant:

list_elem&
    operator=(
      list_elem &&r)
    noexcept
    {
      if (this != &r)
      {
        next = r.next;
        prev = &r;
        r.invariant_check();

        next->prev = this;
        r.next = this;

        TROMPELOEIL_ASSERT(next->prev == this);
        TROMPELOEIL_ASSERT(prev->next == this);

        r.unlink();

        TROMPELOEIL_ASSERT(!r.is_linked());
        invariant_check();
      }
      return *this;
    }